

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O1

DistributionMapping __thiscall
amrex::DistributionMapping::makeKnapSack
          (DistributionMapping *this,Vector<double,_std::allocator<double>_> *rcost,int nmax)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  double *pdVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  DistributionMapping DVar12;
  Vector<long,_std::allocator<long>_> cost;
  Real eff;
  vector<long,_std::allocator<long>_> local_48;
  allocator_type local_30 [8];
  
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0074f850;
  p_Var4[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[5]._M_use_count = 0;
  p_Var4[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[1]._M_use_count = 0;
  p_Var4[1]._M_weak_count = 0;
  p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[2]._M_use_count = 0;
  p_Var4[2]._M_weak_count = 0;
  p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[3]._M_use_count = 0;
  p_Var4[3]._M_weak_count = 0;
  *(undefined8 *)&p_Var4[3]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var4[4]._vptr__Sp_counted_base + 4) = 0;
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var4 + 1);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_48,
             (long)(rcost->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(rcost->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,local_30);
  pdVar2 = (rcost->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (rcost->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar6 = pdVar2 + 1;
  pdVar8 = pdVar2;
  pdVar10 = pdVar2;
  if (pdVar6 != pdVar3 && pdVar2 != pdVar3) {
    do {
      pdVar8 = pdVar6;
      if (*pdVar6 < *pdVar10 || *pdVar6 == *pdVar10) {
        pdVar8 = pdVar10;
      }
      pdVar6 = pdVar6 + 1;
      pdVar10 = pdVar8;
    } while (pdVar6 != pdVar3);
  }
  lVar5 = (long)pdVar3 - (long)pdVar2 >> 3;
  if (0 < lVar5) {
    dVar1 = *pdVar8;
    uVar11 = -(ulong)(dVar1 == 0.0);
    lVar9 = 0;
    do {
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] =
           (long)(pdVar2[lVar9] *
                 (double)(uVar11 & 0x41cdcd6500000000 | ~uVar11 & (ulong)(1000000000.0 / dVar1))) +
           1;
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  KnapSackProcessorMap
            (this,&local_48,*(int *)(DAT_00756620 + -0x38),(Real *)local_30,true,nmax,true);
  _Var7._M_pi = extraout_RDX;
  if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var7._M_pi = extraout_RDX_00;
  }
  DVar12.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  DVar12.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (DistributionMapping)
         DVar12.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DistributionMapping
DistributionMapping::makeKnapSack (const Vector<Real>& rcost, int nmax)
{
    BL_PROFILE("makeKnapSack");

    DistributionMapping r;

    Vector<Long> cost(rcost.size());

    Real wmax = *std::max_element(rcost.begin(), rcost.end());
    Real scale = (wmax == 0) ? 1.e9_rt : 1.e9_rt/wmax;

    for (int i = 0; i < rcost.size(); ++i) {
        cost[i] = Long(rcost[i]*scale) + 1L;
    }

    int nprocs = ParallelContext::NProcsSub();
    Real eff;

    r.KnapSackProcessorMap(cost, nprocs, &eff, true, nmax);

    return r;
}